

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtCentroidCase::init
          (InterpolateAtCentroidCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (this->m_type == TEST_ARRAY_ELEMENT) {
    local_190._0_8_ =
         ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.super_TestCase
          .super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),
               "Testing interpolateAtCentroid with element of array as an argument.",0x43);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_type != TEST_CONSISTENCY) goto LAB_014715aa;
    local_190._0_8_ =
         ((this->super_CentroidRenderCase).super_MultisampleRenderCase.super_TestCase.super_TestCase
          .super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "\tDraw a fan of narrow triangles (large number of pixels on the edges).\n",0x47);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "\tSet varyings \'barycentricsA\' and \'barycentricsB\' to contain barycentric coordinates.\n"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\tAdd centroid-qualifier for barycentricsB.\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\t=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n",
               0x3a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
LAB_014715aa:
  iVar1 = CentroidRenderCase::init(&this->super_CentroidRenderCase,ctx);
  return iVar1;
}

Assistant:

void InterpolateAtCentroidCase::init (void)
{
	// test purpose and expectations
	if (m_type == TEST_CONSISTENCY)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that interpolateAtCentroid does not return different values than a corresponding centroid-qualified varying.\n"
			<< "	Draw a fan of narrow triangles (large number of pixels on the edges).\n"
			<< "	Set varyings 'barycentricsA' and 'barycentricsB' to contain barycentric coordinates.\n"
			<< "	Add centroid-qualifier for barycentricsB.\n"
			<< "	=> interpolateAtCentroid(barycentricsA) ~= barycentricsB\n"
			<< tcu::TestLog::EndMessage;
	}
	else if (m_type == TEST_ARRAY_ELEMENT)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Testing interpolateAtCentroid with element of array as an argument."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	CentroidRenderCase::init();
}